

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O1

void __thiscall wasm::Metrics::printCounts(Metrics *this,string *title)

{
  _Rb_tree_header *p_Var1;
  uint *puVar2;
  pointer ppcVar3;
  int iVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict2 *pmVar6;
  ulong uVar7;
  ostream *poVar8;
  size_t sVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  mapped_type_conflict2 mVar13;
  char *pcVar14;
  int iVar15;
  pointer ppcVar16;
  bool bVar17;
  pointer ppcStack_58;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  char *local_38;
  char *key;
  
  ppcStack_58 = (pointer)0x0;
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var5 = (this->counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->counts)._M_t._M_impl.super__Rb_tree_header;
  mVar13 = 0;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      if (keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_58,
                   (iterator)
                   keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start,(char **)(p_Var5 + 1));
      }
      else {
        *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start = *(char **)(p_Var5 + 1);
        keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      iVar4 = 0;
      if (**(char **)(p_Var5 + 1) != '[') {
        iVar4 = *(int *)&p_Var5[1]._M_parent;
      }
      mVar13 = mVar13 + iVar4;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  local_38 = "[total]";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_58,&local_38);
  local_38 = "[total]";
  pmVar6 = std::
           map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
           ::operator[](&this->counts,&local_38);
  ppcVar3 = keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar16 = ppcStack_58;
  *pmVar6 = mVar13;
  if (ppcStack_58 !=
      keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)ppcStack_58 >> 3;
    lVar10 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Metrics::printCounts(std::__cxx11::string)::_lambda(char_const*,char_const*)_1_>>
              (ppcStack_58,
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::Metrics::printCounts(std::__cxx11::string)::_lambda(char_const*,char_const*)_1_>>
              (ppcVar16,ppcVar3);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  ppcVar3 = keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (ppcVar16 = ppcStack_58; ppcVar16 != ppcVar3; ppcVar16 = ppcVar16 + 1) {
    local_38 = *ppcVar16;
    pmVar6 = std::
             map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[](&this->counts,&local_38);
    iVar4 = *pmVar6;
    if ((iVar4 != 0) || (*local_38 == '[')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      pcVar14 = local_38;
      lVar10 = std::cout;
      *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) =
           *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar10 + -0x18)) = 0xf;
      if (local_38 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(lVar10 + -0x18) + 0x10d4250);
      }
      else {
        sVar9 = strlen(local_38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 8;
      std::ostream::operator<<(&std::cout,iVar4);
      lVar10 = 0x10d20e8;
      if (lastCounts._16_8_ != 0) {
        lVar10 = 0x10d20e8;
        lVar12 = lastCounts._16_8_;
        do {
          bVar17 = *(char **)(lVar12 + 0x20) < local_38;
          if (!bVar17) {
            lVar10 = lVar12;
          }
          lVar12 = *(long *)(lVar12 + 0x10 + (ulong)bVar17 * 8);
        } while (lVar12 != 0);
      }
      if ((lVar10 != 0x10d20e8) && (*(char **)(lVar10 + 0x20) <= local_38)) {
        pmVar6 = std::
                 map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                 ::operator[]((map<const_char_*,_int,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                               *)lastCounts,&local_38);
        iVar15 = iVar4 - *pmVar6;
        if (iVar15 != 0) {
          pcVar14 = "\x1b[32m";
          if (iVar15 != 0 && *pmVar6 <= iVar4) {
            pcVar14 = "\x1b[31m";
          }
          Colors::outputColorCode((ostream *)&std::cout,pcVar14);
          lVar10 = std::cout;
          *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) =
               *(uint *)(operator_new__ + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
          *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar10 + -0x18)) = 8;
          *(uint *)(operator_new__ + *(long *)(lVar10 + -0x18)) =
               *(uint *)(operator_new__ + *(long *)(lVar10 + -0x18)) | 0x800;
          plVar11 = (long *)std::ostream::operator<<(&std::cout,iVar15);
          puVar2 = (uint *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x18);
          *puVar2 = *puVar2 & 0xfffff7ff;
          Colors::outputColorCode((ostream *)&std::cout,"\x1b[0m");
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
  }
  if (ppcStack_58 != (pointer)0x0) {
    operator_delete(ppcStack_58,
                    (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppcStack_58);
  }
  return;
}

Assistant:

void printCounts(std::string title) {
    using std::left;
    using std::noshowpos;
    using std::right;
    using std::setw;
    using std::showpos;

    std::ostream& o = std::cout;
    std::vector<const char*> keys;
    // add total
    int total = 0;
    for (auto& [key, value] : counts) {
      keys.push_back(key);
      // total is of all the normal stuff, not the special [things]
      if (key[0] != '[') {
        total += value;
      }
    }
    keys.push_back("[total]");
    counts["[total]"] = total;
    // sort
    sort(keys.begin(), keys.end(), [](const char* a, const char* b) -> bool {
      // Sort the [..] ones first.
      if (a[0] == '[' && b[0] != '[') {
        return true;
      }
      if (a[0] != '[' && b[0] == '[') {
        return false;
      }
      return strcmp(b, a) > 0;
    });
    o << title << "\n";
    for (auto* key : keys) {
      auto value = counts[key];
      if (value == 0 && key[0] != '[') {
        continue;
      }
      o << " " << left << setw(15) << key << ": " << setw(8) << value;
      if (lastCounts.count(key)) {
        int before = lastCounts[key];
        int after = value;
        if (after - before) {
          if (after > before) {
            Colors::red(o);
          } else {
            Colors::green(o);
          }
          o << right << setw(8);
          o << showpos << after - before << noshowpos;
          Colors::normal(o);
        }
      }
      o << "\n";
    }
  }